

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-reporter.c++
# Opt level: O0

void __thiscall
capnp::compiler::LineBreakTable::LineBreakTable(LineBreakTable *this,ArrayPtr<const_char> content)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *local_48;
  char *local_40;
  char *pos;
  int local_24;
  LineBreakTable *local_20;
  LineBreakTable *this_local;
  ArrayPtr<const_char> content_local;
  
  content_local.ptr = (char *)content.size_;
  this_local = (LineBreakTable *)content.ptr;
  local_20 = this;
  sVar2 = kj::ArrayPtr<const_char>::size((ArrayPtr<const_char> *)&this_local);
  kj::Vector<unsigned_int>::Vector(&this->lineBreaks,sVar2 / 0x28);
  local_24 = 0;
  kj::Vector<unsigned_int>::add<int>(&this->lineBreaks,&local_24);
  local_40 = kj::ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)&this_local);
  while( true ) {
    pcVar4 = local_40;
    pcVar3 = kj::ArrayPtr<const_char>::end((ArrayPtr<const_char> *)&this_local);
    pcVar1 = local_40;
    if (pcVar3 <= pcVar4) break;
    if (*local_40 == '\n') {
      pcVar4 = kj::ArrayPtr<const_char>::begin((ArrayPtr<const_char> *)&this_local);
      local_48 = pcVar1 + (1 - (long)pcVar4);
      kj::Vector<unsigned_int>::add<long>(&this->lineBreaks,(long *)&local_48);
    }
    local_40 = local_40 + 1;
  }
  return;
}

Assistant:

LineBreakTable::LineBreakTable(kj::ArrayPtr<const char> content)
    : lineBreaks(content.size() / 40) {
  lineBreaks.add(0);
  for (const char* pos = content.begin(); pos < content.end(); ++pos) {
    if (*pos == '\n') {
      lineBreaks.add(pos + 1 - content.begin());
    }
  }
}